

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O2

int __thiscall
Inter_Symbol_Generator::Matrix_A_Generator(Inter_Symbol_Generator *this,Array_Data_Symbol *p)

{
  uint8_t **ppuVar1;
  int in_ECX;
  int extraout_EDX;
  uint unaff_EBX;
  long lVar2;
  uint uVar3;
  Inter_Symbol_Generator *this_00;
  long in_R8;
  uint in_R9D;
  
  this_00 = (Inter_Symbol_Generator *)this->_A;
  if (this_00 != (Inter_Symbol_Generator *)0x0) {
    operator_delete(this_00,8);
  }
  ppuVar1 = new_matrix(this_00,p->L,p->L);
  this->_A = ppuVar1;
  LDPC_Matrix_Generator(this,p);
  HALF_Matrix_Generator(this,p);
  for (uVar3 = in_R9D; uVar3 < extraout_EDX + in_R9D; uVar3 = uVar3 + 1) {
    for (lVar2 = 0; (ulong)unaff_EBX + lVar2 < (ulong)(in_ECX + unaff_EBX); lVar2 = lVar2 + 1) {
      *(undefined1 *)(lVar2 + *(long *)(in_R8 + (ulong)uVar3 * 8) + (ulong)unaff_EBX) =
           *(undefined1 *)(*(long *)(&p->sym_len + (ulong)(uVar3 - in_R9D) * 2) + lVar2);
    }
  }
  return unaff_EBX;
}

Assistant:

int Inter_Symbol_Generator::Matrix_A_Generator(class Array_Data_Symbol *p)
{

	if (_A != NULL)
	{
		delete _A;
	}

	_A = new_matrix(p->L, p->L);


	LDPC_Matrix_Generator(p);
	HALF_Matrix_Generator(p);
	I_S_Matrix_Generator(p);
	I_H_Matrix_Generator(p);
	Zero_SxH_Matrix_Generator(p);
	G_LT_Matrix_Generator(p);


	matrix_copy_to(G_LDPC, p->S, p->K, _A, 0, 0);
	matrix_copy_to(I_S, p->S, p->S, _A, 0, p->K);
	matrix_copy_to(Zero_SxH, p->S, p->H, _A, 0, (p->K + p->S));
	matrix_copy_to(G_HALF, p->H, (p->K + p->S), _A, p->S, 0);
	matrix_copy_to(I_H, p->H, p->H, _A, p->S, (p->K + p->S));
	matrix_copy_to(G_LT, p->K, p->L, _A, (p->S + p->H), 0);

	A.resize(p->L, p->L);
	//matrix_A = boost::numeric::ublas::make_matrix_from_pointer(A);

	for (int i = 0; i < p->L; i++)
	{
		for (int j = 0; j < p->L; j++)
		{
			A(i,j) = _A[i][j];
		}
	}
	return 0;
}